

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::set_composite_constant
          (CompilerGLSL *this,ConstantID const_id,TypeID type_id,
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *initializers)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *other;
  uint32_t uVar1;
  SPIRConstantOp *pSVar2;
  mapped_type *this_00;
  uint32_t local_38;
  uint32_t local_34;
  SPIRConstant *local_30;
  SPIRConstant *constant;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *local_20;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *initializers_local;
  CompilerGLSL *this_local;
  TypeID type_id_local;
  ConstantID const_id_local;
  
  local_20 = initializers;
  initializers_local = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)this;
  this_local._0_4_ = type_id.id;
  this_local._4_4_ = const_id.id;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRConstantOp>(&this->super_Compiler,uVar1);
  other = local_20;
  if (pSVar2 == (SPIRConstantOp *)0x0) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    local_30 = Compiler::set<spirv_cross::SPIRConstant,spirv_cross::TypedID<(spirv_cross::Types)1>&>
                         (&this->super_Compiler,uVar1,(TypedID<(spirv_cross::Types)1> *)&this_local)
    ;
    local_34 = this_local._0_4_;
    fill_composite_constant(this,local_30,this_local._0_4_,local_20);
    local_38 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&(this->super_Compiler).forwarded_temporaries,&local_38);
  }
  else {
    constant._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    this_00 = ::std::
              unordered_map<unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>_>
              ::operator[](&this->const_composite_insert_ids,(key_type *)((long)&constant + 4));
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=(this_00,other);
  }
  return;
}

Assistant:

void CompilerGLSL::set_composite_constant(ConstantID const_id, TypeID type_id,
                                          const SmallVector<ConstantID> &initializers)
{
	if (maybe_get<SPIRConstantOp>(const_id))
	{
		const_composite_insert_ids[const_id] = initializers;
		return;
	}

	auto &constant = set<SPIRConstant>(const_id, type_id);
	fill_composite_constant(constant, type_id, initializers);
	forwarded_temporaries.insert(const_id);
}